

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O3

void cgltf_free(cgltf_data *data)

{
  void *pvVar1;
  cgltf_morph_target *pcVar2;
  cgltf_buffer *pcVar3;
  cgltf_morph_target *pcVar4;
  cgltf_primitive *pcVar5;
  cgltf_mesh *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (data == (cgltf_data *)0x0) {
    return;
  }
  (*data->memory_free)(data->memory_user_data,(data->asset).copyright);
  (*data->memory_free)(data->memory_user_data,(data->asset).generator);
  (*data->memory_free)(data->memory_user_data,(data->asset).version);
  (*data->memory_free)(data->memory_user_data,(data->asset).min_version);
  (*data->memory_free)(data->memory_user_data,data->accessors);
  (*data->memory_free)(data->memory_user_data,data->buffer_views);
  if (data->buffers_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      pcVar3 = data->buffers;
      pvVar1 = *(void **)((long)&pcVar3->data + lVar9);
      if (pvVar1 != data->bin) {
        (*data->memory_free)(data->memory_user_data,pvVar1);
        pcVar3 = data->buffers;
      }
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&pcVar3->uri + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar10 < data->buffers_count);
  }
  (*data->memory_free)(data->memory_user_data,data->buffers);
  if (data->meshes_count != 0) {
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,data->meshes[uVar10].name);
      pcVar6 = data->meshes;
      if (pcVar6[uVar10].primitives_count != 0) {
        uVar7 = 0;
        do {
          pcVar5 = pcVar6[uVar10].primitives;
          if (pcVar5[uVar7].attributes_count != 0) {
            lVar9 = 0;
            uVar11 = 0;
            do {
              (*data->memory_free)
                        (data->memory_user_data,
                         *(void **)((long)&(pcVar5[uVar7].attributes)->name + lVar9));
              uVar11 = uVar11 + 1;
              pcVar5 = data->meshes[uVar10].primitives;
              lVar9 = lVar9 + 0x18;
            } while (uVar11 < pcVar5[uVar7].attributes_count);
          }
          (*data->memory_free)(data->memory_user_data,pcVar5[uVar7].attributes);
          pcVar5 = data->meshes[uVar10].primitives;
          if (pcVar5[uVar7].targets_count != 0) {
            uVar11 = 0;
            do {
              pcVar4 = pcVar5[uVar7].targets + uVar11;
              if (pcVar5[uVar7].targets[uVar11].attributes_count != 0) {
                lVar9 = 0;
                uVar8 = 0;
                do {
                  (*data->memory_free)
                            (data->memory_user_data,
                             *(void **)((long)&pcVar4->attributes->name + lVar9));
                  uVar8 = uVar8 + 1;
                  pcVar2 = data->meshes[uVar10].primitives[uVar7].targets;
                  pcVar4 = pcVar2 + uVar11;
                  lVar9 = lVar9 + 0x18;
                } while (uVar8 < pcVar2[uVar11].attributes_count);
              }
              (*data->memory_free)(data->memory_user_data,pcVar4->attributes);
              uVar11 = uVar11 + 1;
              pcVar5 = data->meshes[uVar10].primitives;
            } while (uVar11 < pcVar5[uVar7].targets_count);
          }
          (*data->memory_free)(data->memory_user_data,pcVar5[uVar7].targets);
          uVar7 = uVar7 + 1;
          pcVar6 = data->meshes;
        } while (uVar7 < pcVar6[uVar10].primitives_count);
      }
      (*data->memory_free)(data->memory_user_data,pcVar6[uVar10].primitives);
      (*data->memory_free)(data->memory_user_data,data->meshes[uVar10].weights);
      pcVar6 = data->meshes;
      if (pcVar6[uVar10].target_names_count != 0) {
        uVar7 = 0;
        do {
          (*data->memory_free)(data->memory_user_data,pcVar6[uVar10].target_names[uVar7]);
          uVar7 = uVar7 + 1;
          pcVar6 = data->meshes;
        } while (uVar7 < pcVar6[uVar10].target_names_count);
      }
      (*data->memory_free)(data->memory_user_data,pcVar6[uVar10].target_names);
      uVar10 = uVar10 + 1;
    } while (uVar10 < data->meshes_count);
  }
  (*data->memory_free)(data->memory_user_data,data->meshes);
  if (data->materials_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)
                (data->memory_user_data,
                 *(void **)((long)(data->materials->pbr_metallic_roughness).base_color_texture.
                                  transform.offset + lVar9 + -0x24));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x248;
    } while (uVar10 < data->materials_count);
  }
  (*data->memory_free)(data->memory_user_data,data->materials);
  if (data->images_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->images->name + lVar9));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->images->uri + lVar9));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->images->mime_type + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x30;
    } while (uVar10 < data->images_count);
  }
  (*data->memory_free)(data->memory_user_data,data->images);
  if (data->textures_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->textures->name + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar10 < data->textures_count);
  }
  (*data->memory_free)(data->memory_user_data,data->textures);
  (*data->memory_free)(data->memory_user_data,data->samplers);
  if (data->skins_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->skins->name + lVar9));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->skins->joints + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x38;
    } while (uVar10 < data->skins_count);
  }
  (*data->memory_free)(data->memory_user_data,data->skins);
  if (data->cameras_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->cameras->name + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x40;
    } while (uVar10 < data->cameras_count);
  }
  (*data->memory_free)(data->memory_user_data,data->cameras);
  if (data->lights_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->lights->color + lVar9 + -8));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar10 < data->lights_count);
  }
  (*data->memory_free)(data->memory_user_data,data->lights);
  if (data->nodes_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar9 + -0x60));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar9 + -0x50));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar9 + -0x20));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0xd8;
    } while (uVar10 < data->nodes_count);
  }
  (*data->memory_free)(data->memory_user_data,data->nodes);
  if (data->scenes_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->scenes->name + lVar9));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->scenes->nodes + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar10 < data->scenes_count);
  }
  (*data->memory_free)(data->memory_user_data,data->scenes);
  if (data->animations_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->animations->name + lVar9))
      ;
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->animations->samplers + lVar9));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->animations->channels + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x38;
    } while (uVar10 < data->animations_count);
  }
  (*data->memory_free)(data->memory_user_data,data->animations);
  if (data->extensions_used_count != 0) {
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,data->extensions_used[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < data->extensions_used_count);
  }
  (*data->memory_free)(data->memory_user_data,data->extensions_used);
  if (data->extensions_required_count != 0) {
    uVar10 = 0;
    do {
      (*data->memory_free)(data->memory_user_data,data->extensions_required[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < data->extensions_required_count);
  }
  (*data->memory_free)(data->memory_user_data,data->extensions_required);
  (*data->memory_free)(data->memory_user_data,data->file_data);
  (*data->memory_free)(data->memory_user_data,data);
  return;
}

Assistant:

void cgltf_free(cgltf_data* data)
{
    if (!data)
    {
        return;
    }

    data->memory_free(data->memory_user_data, data->asset.copyright);
    data->memory_free(data->memory_user_data, data->asset.generator);
    data->memory_free(data->memory_user_data, data->asset.version);
    data->memory_free(data->memory_user_data, data->asset.min_version);

    data->memory_free(data->memory_user_data, data->accessors);
    data->memory_free(data->memory_user_data, data->buffer_views);

    for (cgltf_size i = 0; i < data->buffers_count; ++i)
    {
        if (data->buffers[i].data != data->bin)
        {
            data->memory_free(data->memory_user_data, data->buffers[i].data);
        }

        data->memory_free(data->memory_user_data, data->buffers[i].uri);
    }

    data->memory_free(data->memory_user_data, data->buffers);

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->meshes[i].name);

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
            {
                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes[k].name);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes);

            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
            {
                for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                {
                    data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes[m].name);
                }

                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].primitives);
        data->memory_free(data->memory_user_data, data->meshes[i].weights);

        for (cgltf_size j = 0; j < data->meshes[i].target_names_count; ++j)
        {
            data->memory_free(data->memory_user_data, data->meshes[i].target_names[j]);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].target_names);
    }

    data->memory_free(data->memory_user_data, data->meshes);

    for (cgltf_size i = 0; i < data->materials_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->materials[i].name);
    }

    data->memory_free(data->memory_user_data, data->materials);

    for (cgltf_size i = 0; i < data->images_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->images[i].name);
        data->memory_free(data->memory_user_data, data->images[i].uri);
        data->memory_free(data->memory_user_data, data->images[i].mime_type);
    }

    data->memory_free(data->memory_user_data, data->images);

    for (cgltf_size i = 0; i < data->textures_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->textures[i].name);
    }

    data->memory_free(data->memory_user_data, data->textures);

    data->memory_free(data->memory_user_data, data->samplers);

    for (cgltf_size i = 0; i < data->skins_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->skins[i].name);
        data->memory_free(data->memory_user_data, data->skins[i].joints);
    }

    data->memory_free(data->memory_user_data, data->skins);

    for (cgltf_size i = 0; i < data->cameras_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->cameras[i].name);
    }

    data->memory_free(data->memory_user_data, data->cameras);

    for (cgltf_size i = 0; i < data->lights_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->lights[i].name);
    }

    data->memory_free(data->memory_user_data, data->lights);

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->nodes[i].name);
        data->memory_free(data->memory_user_data, data->nodes[i].children);
        data->memory_free(data->memory_user_data, data->nodes[i].weights);
    }

    data->memory_free(data->memory_user_data, data->nodes);

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->scenes[i].name);
        data->memory_free(data->memory_user_data, data->scenes[i].nodes);
    }

    data->memory_free(data->memory_user_data, data->scenes);

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->animations[i].name);
        data->memory_free(data->memory_user_data, data->animations[i].samplers);
        data->memory_free(data->memory_user_data, data->animations[i].channels);
    }

    data->memory_free(data->memory_user_data, data->animations);

    for (cgltf_size i = 0; i < data->extensions_used_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_used[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_used);

    for (cgltf_size i = 0; i < data->extensions_required_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_required[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_required);

    data->memory_free(data->memory_user_data, data->file_data);

    data->memory_free(data->memory_user_data, data);
}